

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall Tigre::String::urlDecode(String *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  int ii;
  String ret;
  char local_f4 [4];
  String local_f0;
  String local_d0;
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  String(&local_d0);
  String(&local_50,"+");
  String(&local_70," ");
  replace(this,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value._M_dataplus._M_p != &local_70.value.field_2) {
    operator_delete(local_70.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.value._M_dataplus._M_p != &local_50.value.field_2) {
    operator_delete(local_50.value._M_dataplus._M_p);
  }
  String(&local_90,"%2B");
  String(&local_b0,"+");
  replace(this,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.value._M_dataplus._M_p != &local_b0.value.field_2) {
    operator_delete(local_b0.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.value._M_dataplus._M_p != &local_90.value.field_2) {
    operator_delete(local_90.value._M_dataplus._M_p);
  }
  if (0 < (int)(this->value)._M_string_length) {
    paVar1 = &local_f0.value.field_2;
    iVar3 = 0;
    do {
      pcVar2 = (this->value)._M_dataplus._M_p;
      if (pcVar2[iVar3] == '%') {
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)this);
        __isoc99_sscanf(local_f0.value._M_dataplus._M_p,"%x",local_f4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.value._M_dataplus._M_p);
        }
        String(&local_f0,(int)local_f4[0]);
        std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0.value._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.value._M_dataplus._M_p);
        }
        iVar3 = iVar3 + 2;
      }
      else {
        String(&local_f0,(int)pcVar2[iVar3]);
        std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0.value._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.value._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.value._M_dataplus._M_p);
        }
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (int)(this->value)._M_string_length);
  }
  std::__cxx11::string::_M_assign((string *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.value._M_dataplus._M_p != &local_d0.value.field_2) {
    operator_delete(local_d0.value._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Tigre::String::urlDecode() {
    String ret;
    char ch;
    int i, ii;
    this->replace("+", " ");
    this->replace("%2B", "+");
    for (i=0; i<this->Count(); i++) {
        if (int(this->value[i])==37) {
            sscanf(this->value.substr(i+1,2).c_str(), "%x", &ii);
            ch=static_cast<char>(ii);
            ret+=ch;
            i=i+2;
        } else {
            ret+= char(this->value[i]);
        }
    }
    this->value = ret.value;
}